

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadIntWithoutSign<unsigned_long>
          (TextReader<fmt::Locale> *this,unsigned_long *value)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ArgList local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  cVar3 = *(this->super_ReaderBase).ptr_;
  bVar1 = cVar3 - 0x30;
  if (bVar1 < 10) {
    uVar4 = 0;
    do {
      uVar5 = ((long)cVar3 + uVar4 * 10) - 0x30;
      if (uVar5 < uVar4) {
        local_48 = 0;
        uStack_40 = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)&local_48;
        DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x1551bb,&local_58);
      }
      pcVar2 = (this->super_ReaderBase).ptr_;
      (this->super_ReaderBase).ptr_ = pcVar2 + 1;
      cVar3 = pcVar2[1];
      uVar4 = uVar5;
    } while ((byte)(cVar3 - 0x30U) < 10);
    *value = uVar5;
  }
  return bVar1 < 10;
}

Assistant:

bool ReadIntWithoutSign(Int& value) {
    char c = *ptr_;
    if (c < '0' || c > '9')
      return false;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    do {
      UInt new_result = result * 10 + (c - '0');
      if (new_result < result)
        ReportError("number is too big");
      result = new_result;
      c = *++ptr_;
    } while (c >= '0' && c <= '9');
    UInt max = std::numeric_limits<Int>::max();
    if (result > max)
      ReportError("number is too big");
    value = result;
    return true;
  }